

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

Literal * fromBinaryenLiteral(BinaryenLiteral x)

{
  bool bVar1;
  BasicType BVar2;
  BasicHeapType BVar3;
  Literal *in_RDI;
  ulong in_stack_00000008;
  string_view local_48;
  undefined1 local_38 [8];
  HeapType heapType;
  Type local_20;
  Type type;
  
  local_20.id = in_stack_00000008;
  if (6 < in_stack_00000008) {
switchD_00d28b9c_default:
    if ((local_20.id < 7) || ((local_20.id & 1) != 0)) {
      __assert_fail("type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                    ,0x84,"Literal fromBinaryenLiteral(BinaryenLiteral)");
    }
    local_38 = (undefined1  [8])wasm::Type::getHeapType(&local_20);
    if ((ulong)local_38 < 0x7d) {
      BVar3 = wasm::HeapType::getBasic((HeapType *)local_38,Unshared);
      switch(BVar3 << 0x1d | BVar3 - ext >> 3) {
      case 0:
      case 3:
        wasm::handle_unreachable
                  ("TODO: extern literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x8c);
      case 1:
      case 2:
      case 4:
      case 6:
      case 7:
      case ext:
        wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x93);
      case 5:
        wasm::handle_unreachable
                  ("TODO: i31",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x89);
      case 9:
        wasm::handle_unreachable
                  ("TODO: string literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x95);
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
        if ((6 < local_20.id) && (((uint)local_20.id & 3) == 2)) {
          wasm::Literal::makeNull(in_RDI,(HeapType)local_38);
          return in_RDI;
        }
        __assert_fail("type.isNullable()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                      ,0x9b,"Literal fromBinaryenLiteral(BinaryenLiteral)");
      }
    }
    bVar1 = wasm::HeapType::isSignature((HeapType *)local_38);
    if (bVar1) {
      wasm::Name::Name((Name *)&local_48,(char *)CONCAT44(x.type._4_4_,(int32_t)x.type));
      wasm::Literal::Literal(in_RDI,(Name)local_48,(HeapType)local_38);
      return in_RDI;
    }
    bVar1 = wasm::HeapType::isData((HeapType *)local_38);
    if (bVar1) {
      wasm::handle_unreachable
                ("TODO: gc data",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                 ,0xa3);
    }
    __assert_fail("heapType.isData()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xa2,"Literal fromBinaryenLiteral(BinaryenLiteral)");
  }
  BVar2 = wasm::Type::getBasic(&local_20);
  switch(BVar2) {
  case none:
  case unreachable:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
               ,0x81);
  case i32:
    (in_RDI->field_0).i32 = (int32_t)x.type;
    (in_RDI->type).id = 2;
    break;
  case i64:
    (in_RDI->field_0).i64 = CONCAT44(x.type._4_4_,(int32_t)x.type);
    (in_RDI->type).id = 3;
    break;
  case f32:
    local_38._0_4_ = (int32_t)x.type;
    wasm::Literal::castToF32(in_RDI,(Literal *)local_38);
    goto LAB_00d28c10;
  case f64:
    local_38 = (undefined1  [8])CONCAT44(x.type._4_4_,(int32_t)x.type);
    wasm::Literal::castToF64(in_RDI,(Literal *)local_38);
LAB_00d28c10:
    wasm::Literal::~Literal((Literal *)local_38);
    break;
  case v128:
    wasm::Literal::Literal(in_RDI,(uint8_t *)&x);
    break;
  default:
    goto switchD_00d28b9c_default;
  }
  return in_RDI;
}

Assistant:

Literal fromBinaryenLiteral(BinaryenLiteral x) {
  auto type = Type(x.type);
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(x.i32);
      case Type::i64:
        return Literal(x.i64);
      case Type::f32:
        return Literal(x.i32).castToF32();
      case Type::f64:
        return Literal(x.i64).castToF64();
      case Type::v128:
        return Literal(x.v128);
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  assert(type.isRef());
  auto heapType = type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic(Unshared)) {
      case HeapType::i31:
        WASM_UNREACHABLE("TODO: i31");
      case HeapType::ext:
      case HeapType::any:
        WASM_UNREACHABLE("TODO: extern literals");
      case HeapType::eq:
      case HeapType::func:
      case HeapType::cont:
      case HeapType::struct_:
      case HeapType::array:
      case HeapType::exn:
        WASM_UNREACHABLE("invalid type");
      case HeapType::string:
        WASM_UNREACHABLE("TODO: string literals");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        assert(type.isNullable());
        return Literal::makeNull(heapType);
    }
  }
  if (heapType.isSignature()) {
    return Literal::makeFunc(Name(x.func), heapType);
  }
  assert(heapType.isData());
  WASM_UNREACHABLE("TODO: gc data");
}